

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool __thiscall
Assimp::PLY::DOM::ParseHeader
          (DOM *this,IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
          bool isBinary)

{
  bool bVar1;
  Logger *pLVar2;
  int local_80;
  undefined1 local_70 [8];
  Element out;
  bool isBinary_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *streamBuffer_local;
  DOM *this_local;
  
  out._71_1_ = isBinary;
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"PLY::DOM::ParseHeader() begin");
  do {
    bVar1 = std::vector<char,_std::allocator<char>_>::empty(buffer);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    SkipComments(buffer);
    Element::Element((Element *)local_70);
    bVar1 = Element::ParseElement(streamBuffer,buffer,(Element *)local_70);
    if (bVar1) {
      std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::push_back
                (&this->alElements,(value_type *)local_70);
LAB_0075a43f:
      local_80 = 0;
    }
    else {
      bVar1 = TokenMatch(buffer,"end_header",10);
      if (!bVar1) {
        IOStreamBuffer<char>::getNextLine(streamBuffer,buffer);
        goto LAB_0075a43f;
      }
      local_80 = 3;
    }
    Element::~Element((Element *)local_70);
  } while (local_80 == 0);
  if ((out._71_1_ & 1) == 0) {
    SkipSpacesAndLineEnd(buffer);
  }
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"PLY::DOM::ParseHeader() succeeded");
  return true;
}

Assistant:

bool PLY::DOM::ParseHeader(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer, bool isBinary) {
    ASSIMP_LOG_DEBUG("PLY::DOM::ParseHeader() begin");

  // parse all elements
  while (!buffer.empty())
  {
    // skip all comments
    PLY::DOM::SkipComments(buffer);

    PLY::Element out;
    if (PLY::Element::ParseElement(streamBuffer, buffer, &out))
    {
      // add the element to the list of elements
      alElements.push_back(out);
    }
    else if (TokenMatch(buffer, "end_header", 10))
    {
      // we have reached the end of the header
      break;
    }
    else
    {
      // ignore unknown header elements
      streamBuffer.getNextLine(buffer);
    }
  }

  if (!isBinary) // it would occur an error, if binary data start with values as space or line end.
    SkipSpacesAndLineEnd(buffer);

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseHeader() succeeded");
  return true;
}